

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

uint32_t Write<aiQuaterniont<float>>(aiQuaternion *v)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t t;
  aiQuaternion *v_local;
  
  uVar1 = Write<float>(&v->w);
  uVar2 = Write<float>(&v->x);
  uVar3 = Write<float>(&v->y);
  uVar4 = Write<float>(&v->z);
  if (uVar4 + uVar3 + uVar2 + uVar1 == 0x10) {
    return 0x10;
  }
  __assert_fail("t == 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/tools/assimp_cmd/WriteDumb.cpp"
                ,0xd8,"uint32_t Write(const aiQuaternion &)");
}

Assistant:

inline uint32_t Write<aiQuaternion>(const aiQuaternion& v)
{
	uint32_t t = Write<float>(v.w);
	t += Write<float>(v.x);
	t += Write<float>(v.y);
	t += Write<float>(v.z);
	ai_assert(t == 16);
	return 16;
}